

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::SetShadingPropertiesRaw
          (FBXConverter *this,aiMaterial *out_mat,PropertyTable *props,TextureMap *textures,
          MeshGeometry *mesh)

{
  Geometry *pGVar1;
  bool bVar2;
  __type _Var3;
  uint uVar4;
  element_type *peVar5;
  aiVector3t<float> *pInput;
  aiColor3D *pInput_00;
  aiColor4t<float> *pInput_01;
  float *pInput_02;
  int *pInput_03;
  bool *pbVar6;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pString;
  pointer __rhs;
  reference ppVar7;
  string *pString_00;
  uint64_t uVar8;
  reference ppVar9;
  mapped_type *pmVar10;
  char *pcVar11;
  aiVector2D *paVar12;
  PropertyTable *pPVar13;
  long lVar14;
  iterator __first;
  difference_type dVar15;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar16;
  undefined1 useTemplate;
  MeshGeometry *local_1380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e8;
  format local_11c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1030;
  format local_1010;
  string local_e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e78;
  string *name_3;
  uint i_1;
  int index_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e48;
  format local_e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  format local_c70;
  int local_af4;
  string local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ad0;
  string *name_2;
  uint i;
  int index_1;
  int *local_ab8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_ab0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_aa8;
  vector<int,_std::allocator<int>_> *local_aa0;
  MatIndexArray *mats;
  MeshGeometry *meshGeom;
  value_type *v;
  iterator __end7;
  iterator __begin7;
  MeshMap *__range7;
  uint local_a5c;
  iterator iStack_a58;
  uint matIndex;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
  local_a50;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
  local_a48;
  iterator materialIt;
  undefined1 local_a38 [32];
  _Rb_tree_node_base local_a18;
  _Base_ptr local_9f8;
  string *uvSet;
  undefined1 local_9e8 [3];
  bool uvFound;
  int uvIndex;
  undefined1 local_9c8 [8];
  aiUVTransform uvTrafo;
  iterator local_990;
  _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_> local_988;
  iterator local_980;
  _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_> local_978;
  const_iterator it_1;
  Video *pVStack_968;
  uint index;
  Video *media;
  undefined1 local_958;
  char local_957 [3];
  aiString path;
  Texture *tex;
  string name_1;
  _Self local_528;
  const_iterator it;
  aiString value_1;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *interpreted_6;
  TypedProperty<bool> *pTStack_108;
  int value;
  TypedProperty<bool> *interpreted_5;
  TypedProperty<int> *interpreted_4;
  TypedProperty<float> *interpreted_3;
  TypedProperty<aiColor4t<float>_> *interpreted_2;
  TypedProperty<aiColor3D> *interpreted_1;
  TypedProperty<aiVector3t<float>_> *interpreted;
  string name;
  value_type *prop;
  iterator __end2;
  iterator __begin2;
  DirectPropertyMap *__range2;
  allocator local_51;
  undefined1 local_50 [8];
  string prefix;
  MeshGeometry *mesh_local;
  TextureMap *textures_local;
  PropertyTable *props_local;
  aiMaterial *out_mat_local;
  FBXConverter *this_local;
  
  prefix.field_2._8_8_ = mesh;
  props_local = (PropertyTable *)out_mat;
  out_mat_local = (aiMaterial *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"$raw.",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  PropertyTable::GetUnparsedProperties_abi_cxx11_((DirectPropertyMap *)&__begin2,props);
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
                    *)&__begin2);
  prop = (value_type *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
                *)&__begin2);
  while (bVar2 = std::operator!=(&__end2,(_Self *)&prop), bVar2) {
    name.field_2._8_8_ =
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>
         ::operator*(&__end2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&interpreted
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   name.field_2._8_8_);
    peVar5 = std::
             __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(name.field_2._8_8_ + 0x20));
    interpreted_1 =
         (TypedProperty<aiColor3D> *)
         Property::As<Assimp::FBX::TypedProperty<aiVector3t<float>>>(peVar5);
    pPVar13 = props_local;
    if ((TypedProperty<aiVector3t<float>_> *)interpreted_1 ==
        (TypedProperty<aiVector3t<float>_> *)0x0) {
      peVar5 = std::
               __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(name.field_2._8_8_ + 0x20));
      interpreted_2 =
           (TypedProperty<aiColor4t<float>_> *)
           Property::As<Assimp::FBX::TypedProperty<aiColor3D>>(peVar5);
      pPVar13 = props_local;
      if (interpreted_2 == (TypedProperty<aiColor4t<float>_> *)0x0) {
        peVar5 = std::
                 __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(name.field_2._8_8_ + 0x20));
        interpreted_3 =
             (TypedProperty<float> *)
             Property::As<Assimp::FBX::TypedProperty<aiColor4t<float>>>(peVar5);
        pPVar13 = props_local;
        if (interpreted_3 == (TypedProperty<float> *)0x0) {
          peVar5 = std::
                   __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(name.field_2._8_8_ + 0x20));
          interpreted_4 =
               (TypedProperty<int> *)Property::As<Assimp::FBX::TypedProperty<float>>(peVar5);
          pPVar13 = props_local;
          if ((TypedProperty<float> *)interpreted_4 == (TypedProperty<float> *)0x0) {
            peVar5 = std::
                     __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(name.field_2._8_8_ + 0x20));
            interpreted_5 =
                 (TypedProperty<bool> *)Property::As<Assimp::FBX::TypedProperty<int>>(peVar5);
            pPVar13 = props_local;
            if (interpreted_5 == (TypedProperty<bool> *)0x0) {
              peVar5 = std::
                       __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)(name.field_2._8_8_ + 0x20));
              pTStack_108 = Property::As<Assimp::FBX::TypedProperty<bool>>(peVar5);
              if (pTStack_108 == (TypedProperty<bool> *)0x0) {
                peVar5 = std::
                         __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)(name.field_2._8_8_ + 0x20));
                this_00 = Property::As<Assimp::FBX::TypedProperty<std::__cxx11::string>>(peVar5);
                if (this_00 !=
                    (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
                  pString = TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::Value(this_00);
                  aiString::aiString((aiString *)((long)&it._M_node + 4),pString);
                  pPVar13 = props_local;
                  pcVar11 = (char *)std::__cxx11::string::c_str();
                  aiMaterial::AddProperty
                            ((aiMaterial *)pPVar13,(aiString *)((long)&it._M_node + 4),pcVar11,0,0);
                }
              }
              else {
                pbVar6 = TypedProperty<bool>::Value(pTStack_108);
                pPVar13 = props_local;
                interpreted_6._4_4_ = *pbVar6 & 1;
                pcVar11 = (char *)std::__cxx11::string::c_str();
                aiMaterial::AddProperty
                          ((aiMaterial *)pPVar13,(int *)((long)&interpreted_6 + 4),1,pcVar11,0,0);
              }
            }
            else {
              pInput_03 = TypedProperty<int>::Value((TypedProperty<int> *)interpreted_5);
              pcVar11 = (char *)std::__cxx11::string::c_str();
              aiMaterial::AddProperty((aiMaterial *)pPVar13,pInput_03,1,pcVar11,0,0);
            }
          }
          else {
            pInput_02 = TypedProperty<float>::Value((TypedProperty<float> *)interpreted_4);
            pcVar11 = (char *)std::__cxx11::string::c_str();
            aiMaterial::AddProperty((aiMaterial *)pPVar13,pInput_02,1,pcVar11,0,0);
          }
        }
        else {
          pInput_01 = TypedProperty<aiColor4t<float>_>::Value
                                ((TypedProperty<aiColor4t<float>_> *)interpreted_3);
          pcVar11 = (char *)std::__cxx11::string::c_str();
          aiMaterial::AddProperty((aiMaterial *)pPVar13,pInput_01,1,pcVar11,0,0);
        }
      }
      else {
        pInput_00 = TypedProperty<aiColor3D>::Value((TypedProperty<aiColor3D> *)interpreted_2);
        pcVar11 = (char *)std::__cxx11::string::c_str();
        aiMaterial::AddProperty((aiMaterial *)pPVar13,pInput_00,1,pcVar11,0,0);
      }
    }
    else {
      pInput = TypedProperty<aiVector3t<float>_>::Value
                         ((TypedProperty<aiVector3t<float>_> *)interpreted_1);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      aiMaterial::AddProperty((aiMaterial *)pPVar13,pInput,1,pcVar11,0,0);
    }
    std::__cxx11::string::~string((string *)&interpreted);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>
    ::operator++(&__end2);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
          *)&__begin2);
  local_528._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
       ::begin(textures);
  do {
    name_1.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
         ::end(textures);
    bVar2 = std::operator!=(&local_528,(_Self *)((long)&name_1.field_2 + 8));
    if (!bVar2) {
      std::__cxx11::string::~string((string *)local_50);
      return;
    }
    __rhs = std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>
            ::operator->(&local_528);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tex,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &__rhs->first);
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>
             ::operator*(&local_528);
    path.data._1016_8_ = ppVar7->second;
    if ((Texture *)path.data._1016_8_ != (Texture *)0x0) {
      aiString::aiString((aiString *)((long)&media + 4));
      pString_00 = Texture::RelativeFilename_abi_cxx11_((Texture *)path.data._1016_8_);
      aiString::Set((aiString *)((long)&media + 4),pString_00);
      pVStack_968 = Texture::Media((Texture *)path.data._1016_8_);
      if ((pVStack_968 != (Video *)0x0) && (uVar8 = Video::ContentLength(pVStack_968), uVar8 != 0))
      {
        local_980._M_node =
             (_Base_ptr)
             std::
             map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
             ::find(&this->textures_converted,&stack0xfffffffffffff698);
        std::_Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>::
        _Rb_tree_const_iterator(&local_978,&local_980);
        local_990._M_node =
             (_Base_ptr)
             std::
             map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
             ::end(&this->textures_converted);
        std::_Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>::
        _Rb_tree_const_iterator(&local_988,&local_990);
        bVar2 = std::operator!=(&local_978,&local_988);
        if (bVar2) {
          ppVar9 = std::
                   _Rb_tree_const_iterator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>
                   ::operator*(&local_978);
          it_1._M_node._4_4_ = ppVar9->second;
        }
        else {
          uVar4 = ConvertVideo(this,pVStack_968);
          it_1._M_node._4_4_ = uVar4;
          pmVar10 = std::
                    map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
                    ::operator[](&this->textures_converted,&stack0xfffffffffffff698);
          *pmVar10 = uVar4;
        }
        local_958 = 0x2a;
        uVar4 = ASSIMP_itoa10(local_957,0x3ff,it_1._M_node._4_4_);
        media._4_4_ = uVar4 + 1;
      }
      pPVar13 = props_local;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &uvTrafo.mRotation,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tex,
                     "|file");
      pcVar11 = (char *)std::__cxx11::string::c_str();
      aiMaterial::AddProperty((aiMaterial *)pPVar13,(aiString *)((long)&media + 4),pcVar11,0x12,0);
      std::__cxx11::string::~string((string *)&uvTrafo.mRotation);
      aiUVTransform::aiUVTransform((aiUVTransform *)local_9c8);
      paVar12 = Texture::UVScaling((Texture *)path.data._1016_8_);
      uvTrafo.mTranslation = *paVar12;
      paVar12 = Texture::UVTranslation((Texture *)path.data._1016_8_);
      pPVar13 = props_local;
      local_9c8 = *(undefined1 (*) [8])paVar12;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tex,
                     "|uvtrafo");
      pcVar11 = (char *)std::__cxx11::string::c_str();
      useTemplate = 0;
      aiMaterial::AddProperty((aiMaterial *)pPVar13,(aiUVTransform *)local_9c8,1,pcVar11,0x12,0);
      std::__cxx11::string::~string((string *)local_9e8);
      uvSet._4_4_ = 0;
      uvSet._3_1_ = 0;
      pPVar13 = Texture::Props((Texture *)path.data._1016_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_a38,"UVSet",(allocator *)((long)&materialIt._M_current + 7));
      PropertyGet<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_a38 + 0x20),(FBX *)pPVar13,(PropertyTable *)local_a38,
                 (string *)((long)&uvSet + 3),(bool *)0x0,(bool)useTemplate);
      std::__cxx11::string::~string((string *)local_a38);
      std::allocator<char>::~allocator((allocator<char> *)((long)&materialIt._M_current + 7));
      local_9f8 = (_Base_ptr)(local_a38 + 0x20);
      if ((((uvSet._3_1_ & 1) != 0) &&
          (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_9f8,"default"), bVar2)) &&
         (lVar14 = std::__cxx11::string::length(), lVar14 != 0)) {
        local_a50._M_current =
             (aiMaterial **)
             std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(&this->materials);
        iStack_a58 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(&this->materials)
        ;
        local_a48 = std::
                    find<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,aiMaterial*>
                              (local_a50,iStack_a58._M_current,(aiMaterial **)&props_local);
        __first = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(&this->materials);
        dVar15 = std::
                 distance<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>>
                           ((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                             )__first._M_current,local_a48);
        local_a5c = (uint)dVar15;
        uvSet._4_4_ = 0xffffffff;
        if (prefix.field_2._8_8_ == 0) {
          __end7 = std::
                   map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   ::begin(&this->meshes_converted);
          v = (value_type *)
              std::
              map<const_Assimp::FBX::Geometry_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<const_Assimp::FBX::Geometry_*>,_std::allocator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::end(&this->meshes_converted);
          while (bVar2 = std::operator!=(&__end7,(_Self *)&v), bVar2) {
            meshGeom = (MeshGeometry *)
                       std::
                       _Rb_tree_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ::operator*(&__end7);
            pGVar1 = (Geometry *)(meshGeom->super_Geometry).super_Object._vptr_Object;
            if (pGVar1 == (Geometry *)0x0) {
              local_1380 = (MeshGeometry *)0x0;
            }
            else {
              local_1380 = (MeshGeometry *)
                           __dynamic_cast(pGVar1,&Geometry::typeinfo,&MeshGeometry::typeinfo,0);
            }
            mats = (MatIndexArray *)local_1380;
            if (local_1380 != (MeshGeometry *)0x0) {
              local_aa0 = MeshGeometry::GetMaterialIndices(local_1380);
              local_ab0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(local_aa0)
              ;
              local_ab8 = (int *)std::vector<int,_std::allocator<int>_>::end(local_aa0);
              local_aa8 = std::
                          find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,unsigned_int>
                                    (local_ab0,
                                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                      )local_ab8,&local_a5c);
              _i = std::vector<int,_std::allocator<int>_>::end(local_aa0);
              bVar2 = __gnu_cxx::operator==
                                (&local_aa8,
                                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&i);
              if (!bVar2) {
                name_2._4_4_ = 0xffffffff;
                for (name_2._0_4_ = 0; (uint)name_2 < 8; name_2._0_4_ = (uint)name_2 + 1) {
                  pvVar16 = MeshGeometry::GetTextureCoords((MeshGeometry *)mats,(uint)name_2);
                  bVar2 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::empty
                                    (pvVar16);
                  if (bVar2) break;
                  MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                            (&local_af0,(MeshGeometry *)mats,(uint)name_2);
                  local_ad0 = &local_af0;
                  _Var3 = std::operator==(local_ad0,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_9f8);
                  if (_Var3) {
                    name_2._4_4_ = (uint)name_2;
                    local_af4 = 9;
                  }
                  else {
                    local_af4 = 0;
                  }
                  std::__cxx11::string::~string((string *)&local_af0);
                  if (local_af4 != 0) break;
                }
                if (name_2._4_4_ == 0xffffffff) {
                  std::operator+(&local_cb0,"did not find UV channel named ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_9f8);
                  std::operator+(&local_c90,&local_cb0," in a mesh using this material");
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  basic_formatter<std::__cxx11::string>
                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_c70,&local_c90);
                  LogFunctions<Assimp::FBXImporter>::LogWarn(&local_c70);
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  ~basic_formatter(&local_c70);
                  std::__cxx11::string::~string((string *)&local_c90);
                  std::__cxx11::string::~string((string *)&local_cb0);
                }
                else if (uvSet._4_4_ == 0xffffffff) {
                  uvSet._4_4_ = name_2._4_4_;
                }
                else {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i_1,"the UV channel named ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_9f8);
                  std::operator+(&local_e48,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&i_1,
                                 " appears at different positions in meshes, results will be wrong")
                  ;
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  basic_formatter<std::__cxx11::string>
                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_e28,&local_e48);
                  LogFunctions<Assimp::FBXImporter>::LogWarn(&local_e28);
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  ~basic_formatter(&local_e28);
                  std::__cxx11::string::~string((string *)&local_e48);
                  std::__cxx11::string::~string((string *)&i_1);
                }
              }
            }
            std::
            _Rb_tree_iterator<std::pair<const_Assimp::FBX::Geometry_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator++(&__end7);
          }
        }
        else {
          name_3._4_4_ = 0xffffffff;
          for (name_3._0_4_ = 0; (uint)name_3 < 8; name_3._0_4_ = (uint)name_3 + 1) {
            pvVar16 = MeshGeometry::GetTextureCoords
                                ((MeshGeometry *)prefix.field_2._8_8_,(uint)name_3);
            bVar2 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::empty
                              (pvVar16);
            if (bVar2) break;
            MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                      (&local_e98,(MeshGeometry *)prefix.field_2._8_8_,(uint)name_3);
            local_e78 = &local_e98;
            _Var3 = std::operator==(local_e78,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_9f8);
            if (_Var3) {
              name_3._4_4_ = (uint)name_3;
              local_af4 = 0xc;
            }
            else {
              local_af4 = 0;
            }
            std::__cxx11::string::~string((string *)&local_e98);
            if (local_af4 != 0) break;
          }
          if (name_3._4_4_ == 0xffffffff) {
            std::operator+(&local_1050,"did not find UV channel named ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_9f8);
            std::operator+(&local_1030,&local_1050," in a mesh using this material");
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1010,&local_1030);
            LogFunctions<Assimp::FBXImporter>::LogWarn(&local_1010);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter(&local_1010);
            std::__cxx11::string::~string((string *)&local_1030);
            std::__cxx11::string::~string((string *)&local_1050);
          }
          if (uvSet._4_4_ == 0xffffffff) {
            uvSet._4_4_ = name_3._4_4_;
          }
        }
        if (uvSet._4_4_ == 0xffffffff) {
          std::operator+(&local_1208,"failed to resolve UV channel ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_9f8);
          std::operator+(&local_11e8,&local_1208,", using first UV channel");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     &local_11c8,&local_11e8);
          LogFunctions<Assimp::FBXImporter>::LogWarn(&local_11c8);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_11c8);
          std::__cxx11::string::~string((string *)&local_11e8);
          std::__cxx11::string::~string((string *)&local_1208);
          uvSet._4_4_ = 0;
        }
      }
      pPVar13 = props_local;
      std::operator+(&local_1228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tex,
                     "|uvwsrc");
      pcVar11 = (char *)std::__cxx11::string::c_str();
      aiMaterial::AddProperty((aiMaterial *)pPVar13,(int *)((long)&uvSet + 4),1,pcVar11,0x12,0);
      std::__cxx11::string::~string((string *)&local_1228);
      std::__cxx11::string::~string((string *)(local_a38 + 0x20));
    }
    std::__cxx11::string::~string((string *)&tex);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>
    ::operator++(&local_528,0);
  } while( true );
}

Assistant:

void FBXConverter::SetShadingPropertiesRaw(aiMaterial* out_mat, const PropertyTable& props, const TextureMap& textures, const MeshGeometry* const mesh)
{
    // Add all the unparsed properties with a "$raw." prefix

    const std::string prefix = "$raw.";

    for (const DirectPropertyMap::value_type& prop : props.GetUnparsedProperties()) {

        std::string name = prefix + prop.first;

        if (const TypedProperty<aiVector3D>* interpreted = prop.second->As<TypedProperty<aiVector3D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<aiColor3D>* interpreted = prop.second->As<TypedProperty<aiColor3D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<aiColor4D>* interpreted = prop.second->As<TypedProperty<aiColor4D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<float>* interpreted = prop.second->As<TypedProperty<float> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<int>* interpreted = prop.second->As<TypedProperty<int> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<bool>* interpreted = prop.second->As<TypedProperty<bool> >())
        {
            int value = interpreted->Value() ? 1 : 0;
            out_mat->AddProperty(&value, 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<std::string>* interpreted = prop.second->As<TypedProperty<std::string> >())
        {
            const aiString value = aiString(interpreted->Value());
            out_mat->AddProperty(&value, name.c_str(), 0, 0);
        }
    }

    // Add the textures' properties

    for (TextureMap::const_iterator it = textures.begin(); it != textures.end(); it++) {

        std::string name = prefix + it->first;

        const Texture* const tex = (*it).second;
        if (tex != nullptr)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr && media->ContentLength() > 0) {
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                }
                else {
                    index = ConvertVideo(*media);
                    textures_converted[media] = index;
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture)
                path.data[0] = '*';
                path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
            }

            out_mat->AddProperty(&path, (name + "|file").c_str(), aiTextureType_UNKNOWN, 0);

            aiUVTransform uvTrafo;
            // XXX handle all kinds of UV transformations
            uvTrafo.mScaling = tex->UVScaling();
            uvTrafo.mTranslation = tex->UVTranslation();
            out_mat->AddProperty(&uvTrafo, 1, (name + "|uvtrafo").c_str(), aiTextureType_UNKNOWN, 0);
 
            int uvIndex = 0;

            bool uvFound = false;
            const std::string& uvSet = PropertyGet<std::string>(tex->Props(), "UVSet", uvFound);
            if (uvFound) {
                // "default" is the name which usually appears in the FbxFileTexture template
                if (uvSet != "default" && uvSet.length()) {
                    // this is a bit awkward - we need to find a mesh that uses this
                    // material and scan its UV channels for the given UV name because
                    // assimp references UV channels by index, not by name.

                    // XXX: the case that UV channels may appear in different orders
                    // in meshes is unhandled. A possible solution would be to sort
                    // the UV channels alphabetically, but this would have the side
                    // effect that the primary (first) UV channel would sometimes
                    // be moved, causing trouble when users read only the first
                    // UV channel and ignore UV channel assignments altogether.

                    std::vector<aiMaterial*>::iterator materialIt = std::find(materials.begin(), materials.end(), out_mat);
                    const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(), materialIt));

                    uvIndex = -1;
                    if (!mesh)
                    {
                        for (const MeshMap::value_type& v : meshes_converted) {
                            const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*>(v.first);
                            if (!meshGeom) {
                                continue;
                            }

                            const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                            if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                continue;
                            }

                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (meshGeom->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                continue;
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                            else {
                                FBXImporter::LogWarn("the UV channel named " + uvSet + " appears at different positions in meshes, results will be wrong");
                            }
                        }
                    }
                    else
                    {
                        int index = -1;
                        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                            if (mesh->GetTextureCoords(i).empty()) {
                                break;
                            }
                            const std::string& name = mesh->GetTextureCoordChannelName(i);
                            if (name == uvSet) {
                                index = static_cast<int>(i);
                                break;
                            }
                        }
                        if (index == -1) {
                            FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                        }

                        if (uvIndex == -1) {
                            uvIndex = index;
                        }
                    }

                    if (uvIndex == -1) {
                        FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                        uvIndex = 0;
                    }
                }
            }

            out_mat->AddProperty(&uvIndex, 1, (name + "|uvwsrc").c_str(), aiTextureType_UNKNOWN, 0);
        }
            }
        }